

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node *
lyd_new_path(lyd_node *data_tree,ly_ctx *ctx,char *path,void *value,LYD_ANYDATA_VALUETYPE value_type
            ,int options)

{
  int iVar1;
  lyd_node *plVar2;
  lys_module *plVar3;
  LYS_NODE LVar4;
  bool bVar5;
  bool bVar6;
  lys_node *local_178;
  char *local_170;
  lys_node *local_158;
  lys_node *local_150;
  char *local_140;
  char *local_130;
  char *local_118;
  int local_100;
  int local_fc;
  int yang_data_name_len;
  int backup_mod_name_len;
  int backup_is_relative;
  int edit_leaf;
  int first_iter;
  int has_predicate;
  int is_relative;
  int val_len;
  int val_name_len;
  int nam_len;
  int mod_name_len;
  int parsed;
  int i;
  int r;
  lys_module *prev_mod;
  lys_module *module;
  lys_node_list *slist;
  lys_node *tmp;
  lys_node *sparent;
  lys_node *schild;
  lyd_node *parent;
  lyd_node *node;
  lyd_node *ret;
  char *yang_data_name;
  char *backup_mod_name;
  char *id;
  char *node_mod_name;
  char *val;
  char *val_name;
  char *name;
  char *mod_name;
  char *str;
  int options_local;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  char *path_local;
  ly_ctx *ctx_local;
  lyd_node *data_tree_local;
  
  yang_data_name = (char *)0x0;
  ret = (lyd_node *)0x0;
  node = (lyd_node *)0x0;
  schild = (lys_node *)0x0;
  nam_len = 0;
  first_iter = -1;
  bVar6 = true;
  str._0_4_ = options;
  str._4_4_ = value_type;
  _options_local = (char *)value;
  value_local = path;
  path_local = (char *)ctx;
  ctx_local = (ly_ctx *)data_tree;
  if (((path == (char *)0x0) || ((data_tree == (lyd_node *)0x0 && (ctx == (ly_ctx *)0x0)))) ||
     ((data_tree == (lyd_node *)0x0 && (*path != '/')))) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_path");
  }
  else {
    if (ctx == (ly_ctx *)0x0) {
      path_local = (char *)data_tree->schema->module->ctx;
    }
    backup_mod_name = path;
    if (data_tree != (lyd_node *)0x0) {
      plVar2 = data_tree;
      if (*path == '/') {
        while (parent = plVar2, nam_len == 0 && parent != (lyd_node *)0x0) {
          if (str._4_4_ < LYD_ANYDATA_JSON) {
            local_118 = _options_local;
          }
          else {
            local_118 = (char *)0x0;
          }
          schild = (lys_node *)
                   resolve_partial_json_data_nodeid
                             (backup_mod_name,local_118,parent,(uint)str,&nam_len);
          plVar2 = parent->next;
        }
        if (nam_len == 0) {
          parent = (lyd_node *)(ctx_local->dict).lock.__data.__list.__prev;
          while( true ) {
            bVar5 = false;
            if (nam_len == 0) {
              bVar5 = parent->next != (lyd_node *)0x0;
            }
            if (!bVar5) break;
            if (str._4_4_ < LYD_ANYDATA_JSON) {
              local_130 = _options_local;
            }
            else {
              local_130 = (char *)0x0;
            }
            schild = (lys_node *)
                     resolve_partial_json_data_nodeid
                               (backup_mod_name,local_130,parent,(uint)str,&nam_len);
            parent = parent->prev;
          }
        }
      }
      else {
        local_140 = (char *)value;
        if (LYD_ANYDATA_STRING < value_type) {
          local_140 = (char *)0x0;
        }
        schild = (lys_node *)
                 resolve_partial_json_data_nodeid(path,local_140,data_tree,options,&nam_len);
      }
      if (nam_len == -1) {
        return (lyd_node *)0x0;
      }
      if (nam_len != 0) {
        if (schild == (lys_node *)0x0) {
          __assert_fail("parent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x778,
                        "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                       );
        }
        first_iter = 1;
        backup_mod_name = backup_mod_name + nam_len;
        if (*backup_mod_name == '\0') {
          if ((((uint)str & 1) == 0) &&
             ((((ulong)schild->dsc & 0x100) == 0 || (((uint)str & 8) != 0)))) {
            ly_vlog((ly_ctx *)path_local,LYE_PATH_EXISTS,LY_VLOG_STR,value_local);
            return (lyd_node *)0x0;
          }
          if ((((ulong)schild->dsc & 0x100) != 0) && (((uint)str & 8) != 0)) {
            return (lyd_node *)0x0;
          }
          plVar2 = lyd_new_path_update((lyd_node *)schild,_options_local,str._4_4_,(uint)str & 8);
          return plVar2;
        }
      }
    }
    iVar1 = first_iter;
    parsed = parse_schema_nodeid(backup_mod_name,&name,&val_name_len,&val_name,&val_len,&first_iter,
                                 (int *)0x0,(int *)0x0,1);
    if (parsed < 1) {
      ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
              (ulong)(uint)(int)backup_mod_name[-parsed],backup_mod_name + -parsed);
    }
    else {
      if (*val_name == '#') {
        if (first_iter != 0) {
          ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,0x23,val_name);
          return (lyd_node *)0x0;
        }
        ret = (lyd_node *)(val_name + 1);
        local_100 = val_len + -1;
        yang_data_name = name;
        local_fc = val_name_len;
        backup_mod_name = backup_mod_name + parsed;
        iVar1 = first_iter;
      }
      first_iter = iVar1;
      parsed = parse_schema_nodeid(backup_mod_name,&name,&val_name_len,&val_name,&val_len,
                                   &first_iter,&edit_leaf,(int *)0x0,0);
      if (parsed < 1) {
        ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                (ulong)(uint)(int)backup_mod_name[-parsed],backup_mod_name + -parsed);
      }
      else {
        backup_mod_name = backup_mod_name + parsed;
        if (yang_data_name != (char *)0x0) {
          name = yang_data_name;
          val_name_len = local_fc;
        }
        if (first_iter == 0) {
          if (schild != (lys_node *)0x0) {
            __assert_fail("!parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x7bd,
                          "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                         );
          }
          if (name == (char *)0x0) {
            mod_name = strndup((char *)value_local,
                               (size_t)(val_name + ((long)val_len - (long)value_local)));
            ly_vlog((ly_ctx *)path_local,LYE_PATH_MISSMOD,LY_VLOG_STR,mod_name);
            free(mod_name);
            return (lyd_node *)0x0;
          }
          _i = ly_ctx_nget_module((ly_ctx *)path_local,name,(long)val_name_len,(char *)0x0,1);
          prev_mod = _i;
          if (_i == (lys_module *)0x0) {
            mod_name = strndup((char *)value_local,
                               (size_t)(name + ((long)val_name_len - (long)value_local)));
            ly_vlog((ly_ctx *)path_local,LYE_PATH_INMOD,LY_VLOG_STR,mod_name);
            free(mod_name);
            return (lyd_node *)0x0;
          }
          name = (char *)0x0;
          val_name_len = 0;
          tmp = (lys_node *)0x0;
          if ((ret != (lyd_node *)0x0) &&
             (tmp = lyp_get_yang_data_template(_i,(char *)ret,local_100), tmp == (lys_node *)0x0)) {
            mod_name = strndup((char *)value_local,(long)ret + ((long)local_100 - (long)value_local)
                              );
            ly_vlog((ly_ctx *)path_local,LYE_PATH_INNODE,LY_VLOG_STR,mod_name);
            free(mod_name);
            return (lyd_node *)0x0;
          }
        }
        else {
          if (ctx_local == (ly_ctx *)0x0) {
            ly_log((ly_ctx *)path_local,LY_LLERR,LY_EINVAL,
                   "%s: provided relative path (%s) without context node.",value_local);
            return (lyd_node *)0x0;
          }
          if (schild == (lys_node *)0x0) {
            schild = (lys_node *)ctx_local;
          }
          tmp = (lys_node *)schild->name;
          _i = lys_node_module(tmp);
          prev_mod = _i;
        }
LAB_0019b6f9:
        sparent = (lys_node *)0x0;
LAB_0019b704:
        do {
          sparent = lys_getnext(sparent,tmp,prev_mod,0);
          if (sparent == (lys_node *)0x0) goto LAB_0019b89d;
        } while ((sparent->nodetype & 0xc1bd) == LYS_UNKNOWN);
        if (name == (char *)0x0) {
          plVar3 = lys_node_module(sparent);
          if (plVar3 != _i) goto LAB_0019b704;
        }
        else {
          plVar3 = lys_node_module(sparent);
          id = plVar3->name;
          iVar1 = strncmp(id,name,(long)val_name_len);
          if ((iVar1 != 0) || (id[val_name_len] != '\0')) goto LAB_0019b704;
        }
        iVar1 = strncmp(sparent->name,val_name,(long)val_len);
        if ((iVar1 != 0) || (sparent->name[val_len] != '\0')) goto LAB_0019b704;
        slist = (lys_node_list *)lys_parent(sparent);
        while( true ) {
          bVar5 = false;
          if (slist != (lys_node_list *)0x0) {
            bVar5 = slist->nodetype == LYS_USES;
          }
          if (!bVar5) break;
          slist = (lys_node_list *)lys_parent((lys_node *)slist);
        }
        if (slist == (lys_node_list *)0x0) goto LAB_0019b89d;
        if (((uint)str & 4) != 0) {
          if (slist->nodetype != LYS_INPUT) goto LAB_0019b89d;
          goto LAB_0019b704;
        }
        if (slist->nodetype == LYS_OUTPUT) goto LAB_0019b704;
LAB_0019b89d:
        if (sparent == (lys_node *)0x0) {
          mod_name = strndup((char *)value_local,
                             (size_t)(val_name + ((long)val_len - (long)value_local)));
          ly_vlog((ly_ctx *)path_local,LYE_PATH_INNODE,LY_VLOG_STR,mod_name);
          free(mod_name);
          lyd_free(node);
          return (lyd_node *)0x0;
        }
        LVar4 = sparent->nodetype;
        if (LVar4 == LYS_CONTAINER) {
LAB_0019b99f:
          if (((uint)str & 2) != 0) {
            mod_name = strndup((char *)value_local,
                               (size_t)(val_name + ((long)val_len - (long)value_local)));
            ly_vlog((ly_ctx *)path_local,LYE_PATH_MISSPAR,LY_VLOG_STR,mod_name);
            free(mod_name);
            lyd_free(node);
            return (lyd_node *)0x0;
          }
          if (first_iter == 0) {
            local_150 = (lys_node *)0x0;
          }
          else {
            local_150 = schild;
          }
          parent = _lyd_new((lyd_node *)local_150,sparent,(uint)(((uint)str & 8) != 0));
        }
        else if ((LVar4 == LYS_LEAF) || (LVar4 == LYS_LEAFLIST)) {
          mod_name = (char *)0x0;
          if (edit_leaf != 0) {
            parsed = parse_schema_json_predicate
                               (backup_mod_name,(char **)0x0,(int *)0x0,&val,&is_relative,
                                &node_mod_name,&has_predicate,&edit_leaf);
            if (parsed < 1) {
              ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                      (ulong)(uint)(int)backup_mod_name[-parsed],backup_mod_name + -parsed);
              lyd_free(node);
              return (lyd_node *)0x0;
            }
            backup_mod_name = backup_mod_name + parsed;
            if ((*val != '.') || (is_relative != 1)) {
              ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                      (ulong)(uint)(int)*val,val);
              lyd_free(node);
              return (lyd_node *)0x0;
            }
            mod_name = strndup(node_mod_name,(long)has_predicate);
            if (mod_name == (char *)0x0) {
              ly_log((ly_ctx *)path_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lyd_new_path");
              lyd_free(node);
              return (lyd_node *)0x0;
            }
          }
          if (*backup_mod_name != '\0') {
            ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                    (ulong)(uint)(int)*backup_mod_name,backup_mod_name);
            free(mod_name);
            lyd_free(node);
            return (lyd_node *)0x0;
          }
          if ((((uint)str & 0x20) == 0) || (sparent->nodetype != LYS_LEAF)) {
            backup_mod_name_len = 0;
          }
          else {
            backup_mod_name_len = 1;
          }
          if (first_iter == 0) {
            local_158 = (lys_node *)0x0;
          }
          else {
            local_158 = schild;
          }
          if (mod_name == (char *)0x0) {
            local_170 = _options_local;
          }
          else {
            local_170 = mod_name;
          }
          parent = _lyd_new_leaf((lyd_node *)local_158,sparent,local_170,
                                 (uint)(((uint)str & 8) != 0),backup_mod_name_len);
          free(mod_name);
        }
        else {
          if (LVar4 == LYS_LIST) goto LAB_0019b99f;
          if (LVar4 != LYS_ANYXML) {
            if (((LVar4 == LYS_NOTIF) || (LVar4 == LYS_RPC)) || (LVar4 == LYS_ACTION))
            goto LAB_0019b99f;
            if (LVar4 != LYS_ANYDATA) {
              ly_log((ly_ctx *)path_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                     ,0x854);
              parent = (lyd_node *)0x0;
              goto LAB_0019bdb0;
            }
          }
          if (*backup_mod_name != '\0') {
            ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                    (ulong)(uint)(int)*backup_mod_name,backup_mod_name);
            lyd_free(node);
            return (lyd_node *)0x0;
          }
          if ((str._4_4_ < LYD_ANYDATA_JSON) && (_options_local == (char *)0x0)) {
            str._4_4_ = LYD_ANYDATA_CONSTSTRING;
            _options_local = "";
          }
          if (first_iter == 0) {
            local_178 = (lys_node *)0x0;
          }
          else {
            local_178 = schild;
          }
          parent = lyd_create_anydata((lyd_node *)local_178,sparent,_options_local,str._4_4_);
        }
LAB_0019bdb0:
        if (parent == (lyd_node *)0x0) {
          mod_name = strndup((char *)value_local,(long)backup_mod_name - (long)value_local);
          if (first_iter == 0) {
            ly_vlog((ly_ctx *)path_local,LYE_SPEC,LY_VLOG_STR,mod_name,
                    "Failed to create node \"%s\".",sparent->name);
          }
          else {
            ly_vlog((ly_ctx *)path_local,LYE_SPEC,LY_VLOG_STR,mod_name,
                    "Failed to create node \"%s\" as a child of \"%s\".",sparent->name,
                    *(undefined8 *)schild->name);
          }
          free(mod_name);
          lyd_free(node);
          return (lyd_node *)0x0;
        }
        if (first_iter == 0) {
          if (ctx_local != (ly_ctx *)0x0) {
            while (*(long *)((long)&(ctx_local->dict).lock + 0x10) != 0) {
              ctx_local = *(ly_ctx **)((long)&(ctx_local->dict).lock + 0x10);
            }
            iVar1 = lyd_insert_after((lyd_node *)ctx_local,parent);
            if (iVar1 != 0) {
              lyd_free(node);
              return (lyd_node *)0x0;
            }
          }
          first_iter = 1;
        }
        if (bVar6) {
          tmp = parent->schema;
          do {
            tmp = lys_parent(tmp);
            bVar6 = false;
            if (tmp != (lys_node *)0x0) {
              LVar4 = LYS_INPUT;
              if (((uint)str & 4) != 0) {
                LVar4 = LYS_OUTPUT;
              }
              bVar6 = tmp->nodetype != LVar4;
            }
          } while (bVar6);
          if ((tmp != (lys_node *)0x0) && (iVar1 = lyd_schema_sort(parent,0), iVar1 != 0)) {
            lyd_free(node);
            return (lyd_node *)0x0;
          }
          node = parent;
          bVar6 = false;
        }
        nam_len = 0;
        if (((sparent->nodetype == LYS_LIST) && (edit_leaf != 0)) &&
           (iVar1 = lyd_new_path_list_predicate(parent,val_name,backup_mod_name,&nam_len),
           iVar1 != 0)) {
          lyd_free(node);
          return (lyd_node *)0x0;
        }
        backup_mod_name = backup_mod_name + nam_len;
        if (*backup_mod_name == '\0') {
          if (((uint)str & 0x10) != 0) {
            return parent;
          }
          return node;
        }
        schild = (lys_node *)parent;
        tmp = sparent;
        _i = lys_node_module(sparent);
        parsed = parse_schema_nodeid(backup_mod_name,&name,&val_name_len,&val_name,&val_len,
                                     &first_iter,&edit_leaf,(int *)0x0,0);
        if (0 < parsed) {
          backup_mod_name = backup_mod_name + parsed;
          if ((sparent->nodetype == LYS_LIST) && (name == (char *)0x0)) {
            module = (lys_module *)sparent;
            for (mod_name_len = 0; mod_name_len < (int)(uint)*(byte *)((long)&module->dsc + 6);
                mod_name_len = mod_name_len + 1) {
              iVar1 = strncmp((char *)**(undefined8 **)
                                        (module->augment->padding + (long)mod_name_len * 8 + -0x1c),
                              val_name,(long)val_len);
              if ((iVar1 == 0) &&
                 (*(char *)(**(long **)(module->augment->padding + (long)mod_name_len * 8 + -0x1c) +
                           (long)val_len) == '\0')) {
                if (*backup_mod_name != '\0') {
                  ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                          (ulong)(uint)(int)*backup_mod_name,backup_mod_name);
                  lyd_free(node);
                  return (lyd_node *)0x0;
                }
                return node;
              }
            }
          }
          goto LAB_0019b6f9;
        }
        ly_vlog((ly_ctx *)path_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                (ulong)(uint)(int)backup_mod_name[-parsed],backup_mod_name + -parsed);
        lyd_free(node);
      }
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_path(struct lyd_node *data_tree, const struct ly_ctx *ctx, const char *path, void *value,
             LYD_ANYDATA_VALUETYPE value_type, int options)
{
    char *str;
    const char *mod_name, *name, *val_name, *val, *node_mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    struct lyd_node *ret = NULL, *node, *parent = NULL;
    const struct lys_node *schild, *sparent, *tmp;
    const struct lys_node_list *slist;
    const struct lys_module *module, *prev_mod;
    int r, i, parsed = 0, mod_name_len, nam_len, val_name_len, val_len;
    int is_relative = -1, has_predicate, first_iter = 1, edit_leaf;
    int backup_is_relative, backup_mod_name_len, yang_data_name_len;

    if (!path || (!data_tree && !ctx)
            || (!data_tree && (path[0] != '/'))) {
        LOGARG;
        return NULL;
    }

    if (!ctx) {
        ctx = data_tree->schema->module->ctx;
    }

    id = path;

    if (data_tree) {
        if (path[0] == '/') {
            /* absolute path, go through all the siblings and try to find the right parent, if exists,
             * first go through all the next siblings keeping the original order, for positional predicates */
            for (node = data_tree; !parsed && node; node = node->next) {
                parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                          options, &parsed);
            }
            if (!parsed) {
                for (node = data_tree->prev; !parsed && node->next; node = node->prev) {
                    parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                              options, &parsed);
                }
            }
        } else {
            /* relative path, use only the provided data tree root */
            parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, data_tree,
                                                      options, &parsed);
        }
        if (parsed == -1) {
            return NULL;
        }
        if (parsed) {
            assert(parent);
            /* if we parsed something we have a relative path now for sure, otherwise we don't know */
            is_relative = 1;

            id += parsed;

            if (!id[0]) {
                /* the node exists, are we supposed to update it or is it default? */
                if (!(options & LYD_PATH_OPT_UPDATE) && (!parent->dflt || (options & LYD_PATH_OPT_DFLT))) {
                    LOGVAL(ctx, LYE_PATH_EXISTS, LY_VLOG_STR, path);
                    return NULL;
                }

                /* no change, the default node already exists */
                if (parent->dflt && (options & LYD_PATH_OPT_DFLT)) {
                    return NULL;
                }

                return lyd_new_path_update(parent, value, value_type, options & LYD_PATH_OPT_DFLT);
            }
        }
    }

    backup_is_relative = is_relative;
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        /* move to the next node in the path */
        id += r;
    } else {
        is_relative = backup_is_relative;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    /* move to the next node in the path */
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    /* prepare everything for the schema search loop */
    if (is_relative) {
        /* we are relative to data_tree or parent if some part of the path already exists */
        if (!data_tree) {
            LOGERR(ctx, LY_EINVAL, "%s: provided relative path (%s) without context node.", path);
            return NULL;
        } else if (!parent) {
            parent = data_tree;
        }
        sparent = parent->schema;
        module = prev_mod = lys_node_module(sparent);
    } else {
        /* we are starting from scratch, absolute path */
        assert(!parent);
        if (!mod_name) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        module = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

        if (!module) {
            str = strndup(path, (mod_name + mod_name_len) - path);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        mod_name = NULL;
        mod_name_len = 0;
        prev_mod = module;

        sparent = NULL;
        if (yang_data_name) {
            sparent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!sparent) {
                str = strndup(path, (yang_data_name + yang_data_name_len) - path);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }
    }

    /* create nodes in a loop */
    while (1) {
        /* find the schema node */
        schild = NULL;
        while ((schild = lys_getnext(schild, sparent, module, 0))) {
            if (schild->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST
                                    | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                /* module comparison */
                if (mod_name) {
                    node_mod_name = lys_node_module(schild)->name;
                    if (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                        continue;
                    }
                } else if (lys_node_module(schild) != prev_mod) {
                    continue;
                }

                /* name check */
                if (strncmp(schild->name, name, nam_len) || schild->name[nam_len]) {
                    continue;
                }

                /* RPC/action in/out check */
                for (tmp = lys_parent(schild); tmp && (tmp->nodetype == LYS_USES); tmp = lys_parent(tmp));
                if (tmp) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (tmp->nodetype == LYS_INPUT) {
                            continue;
                        }
                    } else {
                        if (tmp->nodetype == LYS_OUTPUT) {
                            continue;
                        }
                    }
                }

                break;
            }
        }

        if (!schild) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            lyd_free(ret);
            return NULL;
        }

        /* we have the right schema node */
        switch (schild->nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            if (options & LYD_PATH_OPT_NOPARENT) {
                /* these were supposed to exist */
                str = strndup(path, (name + nam_len) - path);
                LOGVAL(ctx, LYE_PATH_MISSPAR, LY_VLOG_STR, str);
                free(str);
                lyd_free(ret);
                return NULL;
            }
            node = _lyd_new(is_relative ? parent : NULL, schild, (options & LYD_PATH_OPT_DFLT) ? 1 : 0);
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            str = NULL;
            if (has_predicate) {
                if ((r = parse_schema_json_predicate(id, NULL, NULL, &val_name, &val_name_len, &val, &val_len, &has_predicate)) < 1) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                    lyd_free(ret);
                    return NULL;
                }
                id += r;

                if ((val_name[0] != '.') || (val_name_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, val_name[0], val_name);
                    lyd_free(ret);
                    return NULL;
                }

                str = strndup(val, val_len);
                if (!str) {
                    LOGMEM(ctx);
                    lyd_free(ret);
                    return NULL;
                }
            }
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                free(str);
                lyd_free(ret);
                return NULL;
            }

            if ((options & LYD_PATH_OPT_EDIT) && schild->nodetype == LYS_LEAF) {
                edit_leaf = 1;
            } else {
                edit_leaf = 0;
            }
            node = _lyd_new_leaf(is_relative ? parent : NULL, schild, (str ? str : value),
                                 (options & LYD_PATH_OPT_DFLT) ? 1 : 0, edit_leaf);
            free(str);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                lyd_free(ret);
                return NULL;
            }
            if (value_type <= LYD_ANYDATA_STRING && !value) {
                value_type = LYD_ANYDATA_CONSTSTRING;
                value = "";
            }
            node = lyd_create_anydata(is_relative ? parent : NULL, schild, value, value_type);
            break;
        default:
            LOGINT(ctx);
            node = NULL;
            break;
        }

        if (!node) {
            str = strndup(path, id - path);
            if (is_relative) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\" as a child of \"%s\".",
                       schild->name, parent->schema->name);
            } else {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\".", schild->name);
            }
            free(str);
            lyd_free(ret);
            return NULL;
        }
        /* special case when we are creating a sibling of a top-level data node */
        if (!is_relative) {
            if (data_tree) {
                for (; data_tree->next; data_tree = data_tree->next);
                if (lyd_insert_after(data_tree, node)) {
                    lyd_free(ret);
                    return NULL;
                }
            }
            is_relative = 1;
        }

        if (first_iter) {
            /* sort if needed, but only when inserted somewhere */
            sparent = node->schema;
            do {
                sparent = lys_parent(sparent);
            } while (sparent && (sparent->nodetype != ((options & LYD_PATH_OPT_OUTPUT) ? LYS_OUTPUT : LYS_INPUT)));
            if (sparent && lyd_schema_sort(node, 0)) {
                lyd_free(ret);
                return NULL;
            }

            /* set first created node */
            ret = node;
            first_iter = 0;
        }

        parsed = 0;
        if ((schild->nodetype == LYS_LIST) && has_predicate && lyd_new_path_list_predicate(node, name, id, &parsed)) {
            lyd_free(ret);
            return NULL;
        }
        id += parsed;

        if (!id[0]) {
            /* we are done */
            if (options & LYD_PATH_OPT_NOPARENTRET) {
                /* last created node */
                return node;
            }
            return ret;
        }

        /* prepare for another iteration */
        parent = node;
        sparent = schild;
        prev_mod = lys_node_module(schild);

        /* parse another node */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            lyd_free(ret);
            return NULL;
        }
        id += r;

        /* if a key of a list was supposed to be created, it is created as a part of the list instance creation */
        if ((schild->nodetype == LYS_LIST) && !mod_name) {
            slist = (const struct lys_node_list *)schild;
            for (i = 0; i < slist->keys_size; ++i) {
                if (!strncmp(slist->keys[i]->name, name, nam_len) && !slist->keys[i]->name[nam_len]) {
                    /* the path continues? there cannot be anything after a key (leaf) */
                    if (id[0]) {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        lyd_free(ret);
                        return NULL;
                    }
                    return ret;
                }
            }
        }
    }

    LOGINT(ctx);
    return NULL;
}